

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O2

void Node_AddNotify(node *Node,dataid Id,notifyproc Func,void *Referer)

{
  long lVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  nodenotify Origin;
  
  if (Node != (node *)0x0) {
    lVar1 = *Node->VMT;
    puVar2 = (undefined8 *)Node_GetData(Node,Id,0xe);
    if (puVar2 == (undefined8 *)0x0) {
      Origin.Next = (nodenotify *)0x0;
      Origin.Func = (notifyproc)0x0;
      Origin.Referer = (void *)0x0;
      puVar2 = (undefined8 *)Node_AddData(Node,Id,0xe,&Origin);
      if (puVar2 == (undefined8 *)0x0) {
        return;
      }
    }
    puVar3 = *(undefined8 **)(lVar1 + 0x80);
    puVar3 = (undefined8 *)(*(code *)*puVar3)(puVar3,0x18);
    if (puVar3 != (undefined8 *)0x0) {
      puVar3[1] = Func;
      puVar3[2] = Referer;
      *puVar3 = *puVar2;
      *puVar2 = puVar3;
    }
  }
  return;
}

Assistant:

NOINLINE void Node_AddNotify(node* Node, dataid Id, notifyproc Func, void* Referer)
{
    if (Node)
    {
        nodecontext* p = Node_Context(Node);
        nodenotify* n;
        nodenotify* Ptr;

        Ptr = Node_GetData(Node,Id,TYPE_NODENOTIFY);
        if (!Ptr)
        {
            nodenotify Origin = {NULL,NULL,NULL};
            Ptr = Node_AddData(Node,Id,TYPE_NODENOTIFY,&Origin);
            if (!Ptr)
            {
                // Something went wrong ! No more memory ?
                return;
            }
        }

        n = MemHeap_Alloc(p->NodeHeap,sizeof(nodenotify));
        if (!n)
        {
            return;
        }

        n->Func = Func;
        n->Referer = Referer;
        n->Next = Ptr->Next;
        Ptr->Next = n;
    }
}